

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_type_declaration
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  string *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_02;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  allocator<char> local_19;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,TYPE_DECLARATION);
  if ((this->cur_token).type == TK_TYPE) {
    next(this);
    if ((this->cur_token).type == TK_IDENTIFIER) {
      next(this);
      bVar1 = parse_type_declarator(this,parent_00);
      if (bVar1) {
        next(this);
        if ((this->cur_token).type == TK_SEMICOLON) {
          next(this);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_19);
        local_30._M_len = 0x23;
        local_30._M_str = "\';\' expected after type declaration";
        args_02._M_len = 1;
        args_02._M_array = &local_30;
        append_syntax_error(this,&local_50,0x3a1,args_02);
        this_00 = &local_50;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_19);
        local_30._M_len = 0x1a;
        local_30._M_str = "<type declarator> expected";
        args_01._M_len = 1;
        args_01._M_array = &local_30;
        process_failover(this,&local_70,0x39c,args_01,true);
        this_00 = &local_70;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_19);
      local_30._M_len = 0x15;
      local_30._M_str = "<identifier> expected";
      args_00._M_len = 1;
      args_00._M_array = &local_30;
      process_failover(this,&local_90,0x397,args_00,true);
      this_00 = &local_90;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_19);
    local_30._M_len = 0xf;
    local_30._M_str = "\'type\' expected";
    args._M_len = 1;
    args._M_array = &local_30;
    process_failover(this,&local_b0,0x392,args,true);
    this_00 = &local_b0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ast::parse_type_declaration(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(TYPE_DECLARATION);

    if (cur_token != tokenizer::TK_TYPE) {
        return failover({"'type' expected"});
    }
    next();

    if (cur_token != tokenizer::TK_IDENTIFIER) {
        return failover({"<identifier> expected"});
    }
    next();

    if (!parse_type_declarator(node)) {
        return failover({"<type declarator> expected"});
    }
    next();

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after type declaration"});
    }
    next();

    return true;
}